

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.h
# Opt level: O0

void __thiscall
jrtplib::RTPUDPv4TransmissionParams::RTPUDPv4TransmissionParams(RTPUDPv4TransmissionParams *this)

{
  RTPUDPv4TransmissionParams *this_local;
  
  RTPTransmissionParams::RTPTransmissionParams(&this->super_RTPTransmissionParams,IPv4UDPProto);
  (this->super_RTPTransmissionParams)._vptr_RTPTransmissionParams =
       (_func_int **)&PTR__RTPUDPv4TransmissionParams_00191a88;
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list(&this->localIPs);
  *(undefined2 *)&(this->super_RTPTransmissionParams).field_0xc = 5000;
  this->bindIP = 0;
  this->multicastTTL = '\x01';
  this->mcastifaceIP = 0;
  this->rtpsendbuf = 0x8000;
  this->rtprecvbuf = 0x8000;
  this->rtcpsendbuf = 0x8000;
  this->rtcprecvbuf = 0x8000;
  this->rtcpmux = false;
  this->allowoddportbase = false;
  this->forcedrtcpport = 0;
  this->useexistingsockets = false;
  this->rtpsock = 0;
  this->rtcpsock = 0;
  this->m_pAbortDesc = (RTPAbortDescriptors *)0x0;
  return;
}

Assistant:

inline RTPUDPv4TransmissionParams::RTPUDPv4TransmissionParams() : RTPTransmissionParams(RTPTransmitter::IPv4UDPProto)	
{ 
	portbase = RTPUDPV4TRANS_DEFAULTPORTBASE; 
	bindIP = 0; 
	multicastTTL = 1; 
	mcastifaceIP = 0; 
	rtpsendbuf = RTPUDPV4TRANS_RTPTRANSMITBUFFER; 
	rtprecvbuf = RTPUDPV4TRANS_RTPRECEIVEBUFFER; 
	rtcpsendbuf = RTPUDPV4TRANS_RTCPTRANSMITBUFFER; 
	rtcprecvbuf = RTPUDPV4TRANS_RTCPRECEIVEBUFFER; 
	rtcpmux = false;
	allowoddportbase = false;
	forcedrtcpport = 0;
	useexistingsockets = false;
	rtpsock = 0;
	rtcpsock = 0;
	m_pAbortDesc = 0;
}